

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_test.cpp
# Opt level: O1

void __thiscall
TimedMutexTest_TryLockUntilTimeout_Test<yamc::alternate::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>_>
::TestBody(TimedMutexTest_TryLockUntilTimeout_Test<yamc::alternate::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>_>
           *this)

{
  undefined8 *puVar1;
  size_type sVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  pointer *__ptr;
  char *message;
  char *in_R9;
  AssertionResult gtest_ar_;
  join_thread thd;
  AssertionResult gtest_ar;
  barrier step;
  TypeParam mtx;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_138;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_130;
  undefined8 *local_128;
  AssertHelper local_120;
  thread local_118;
  string local_110;
  barrier local_f0;
  undefined8 local_80;
  condition_variable local_78 [48];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  local_f0.nthread_ = 2;
  local_f0.count_ = 2;
  local_f0.step_ = 0;
  std::condition_variable::condition_variable(&local_f0.cv_);
  local_f0.mtx_.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_f0.mtx_.super___mutex_base._M_mutex._16_8_ = 0;
  local_f0.mtx_.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_f0.mtx_.super___mutex_base._M_mutex.__align = 0;
  local_f0.mtx_.super___mutex_base._M_mutex._8_8_ = 0;
  local_80 = 0;
  std::condition_variable::condition_variable(local_78);
  local_28 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_110._M_dataplus._M_p = (pointer)&local_80;
  local_110._M_string_length = (size_type)&local_f0;
  std::thread::
  thread<TimedMutexTest_TryLockUntilTimeout_Test<yamc::alternate::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>>::TestBody()::_lambda()_1_,,void>
            (&local_118,(anon_class_16_2_20c777b2_for__M_head_impl *)&local_110);
  yamc::test::barrier::await(&local_f0);
  lVar4 = std::chrono::_V2::system_clock::now();
  lVar5 = std::chrono::_V2::system_clock::now();
  local_110._M_dataplus._M_p = (pointer)(lVar5 + 300000000);
  bVar3 = yamc::alternate::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>::
          do_try_lockwait<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                    ((basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer> *)&local_80,
                     (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      *)&local_110);
  local_130._M_head_impl._0_1_ = !bVar3;
  local_128 = (undefined8 *)0x0;
  if (bVar3) {
    testing::Message::Message((Message *)&local_138);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_110,(internal *)&local_130,
               (AssertionResult *)
               "mtx.try_lock_until(std::chrono::system_clock::now() + std::chrono::milliseconds(300))"
               ,"true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/basic_test.cpp"
               ,0x149,local_110._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_120,(Message *)&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    if (local_138._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_138._M_head_impl + 8))();
    }
  }
  puVar1 = local_128;
  if (local_128 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_128 != local_128 + 2) {
      operator_delete((undefined8 *)*local_128);
    }
    operator_delete(puVar1);
  }
  local_130._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x12c;
  lVar5 = std::chrono::_V2::system_clock::now();
  local_138._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((lVar5 - lVar4) / 1000);
  testing::internal::
  CmpHelperLE<std::chrono::duration<long,std::ratio<1l,1000l>>,std::chrono::duration<long,std::ratio<1l,1000000l>>>
            ((internal *)&local_110,"std::chrono::milliseconds(300)","sw.elapsed()",
             (duration<long,_std::ratio<1L,_1000L>_> *)&local_130,
             (duration<long,_std::ratio<1L,_1000000000L>_> *)&local_138);
  if ((char)local_110._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_130);
    if ((barrier *)local_110._M_string_length == (barrier *)0x0) {
      message = "";
    }
    else {
      message = (char *)*(size_t *)local_110._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/basic_test.cpp"
               ,0x14a,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_138,(Message *)&local_130);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_138);
    if (local_130._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_130._M_head_impl + 8))();
    }
  }
  sVar2 = local_110._M_string_length;
  if ((barrier *)local_110._M_string_length != (barrier *)0x0) {
    if ((size_t *)*(size_t *)local_110._M_string_length !=
        (size_t *)(local_110._M_string_length + 0x10)) {
      operator_delete((undefined1 *)*(size_t *)local_110._M_string_length);
    }
    operator_delete((void *)sVar2);
  }
  yamc::test::barrier::await(&local_f0);
  yamc::test::join_thread::~join_thread((join_thread *)&local_118);
  std::condition_variable::~condition_variable(local_78);
  std::condition_variable::~condition_variable(&local_f0.cv_);
  return;
}

Assistant:

TYPED_TEST(TimedMutexTest, TryLockUntilTimeout)
{
  yamc::test::barrier step(2);
  TypeParam mtx;
  yamc::test::join_thread thd([&]{
    ASSERT_NO_THROW(mtx.lock());
    step.await();  // b1
    step.await();  // b2
    ASSERT_NO_THROW(mtx.unlock());
  });
  {
    step.await();  // b1
    yamc::test::stopwatch<> sw;
    EXPECT_FALSE(mtx.try_lock_until(std::chrono::system_clock::now() + TEST_EXPECT_TIMEOUT));
    EXPECT_LE(TEST_EXPECT_TIMEOUT, sw.elapsed());
    step.await();  // b2
  }
}